

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

CTransactionRef __thiscall
TxPackageTest::create_placeholder_tx(TxPackageTest *this,size_t num_inputs,size_t num_outputs)

{
  uchar *puVar1;
  long lVar2;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  size_type in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar3;
  RandomMixin<FastRandomContext> *this_01;
  long in_FS_OFFSET;
  bool bVar4;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  CTransactionRef CVar5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  CMutableTransaction mtx;
  uint256 local_b8;
  uint256 local_98;
  undefined1 local_78 [32];
  CScript random_script;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&mtx);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&mtx.vin,num_outputs);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&mtx.vout,in_RCX);
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  this_01 = (RandomMixin<FastRandomContext> *)(num_inputs + 0x110);
  RandomMixin<FastRandomContext>::rand256(&local_98,this_01);
  ToByteVector<uint256>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,&local_98);
  b._M_extent._M_extent_value =
       (long)local_108._M_impl.super__Vector_impl_data._M_finish -
       (long)local_108._M_impl.super__Vector_impl_data._M_start;
  b._M_ptr = local_108._M_impl.super__Vector_impl_data._M_start;
  this_00 = CScript::operator<<((CScript *)local_78,b);
  RandomMixin<FastRandomContext>::rand256(&local_b8,this_01);
  ToByteVector<uint256>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,&local_b8);
  b_00._M_extent._M_extent_value =
       (long)local_120._M_impl.super__Vector_impl_data._M_finish -
       (long)local_120._M_impl.super__Vector_impl_data._M_start;
  b_00._M_ptr = local_120._M_impl.super__Vector_impl_data._M_start;
  other = &CScript::operator<<(this_00,b_00)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&random_script.super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
  lVar3 = 0x28;
  while (bVar4 = num_outputs != 0, num_outputs = num_outputs - 1, bVar4) {
    RandomMixin<FastRandomContext>::rand256((uint256 *)local_78,this_01);
    puVar1 = ((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar3 + -0x18;
    *(undefined8 *)puVar1 = local_78._16_8_;
    *(undefined8 *)(puVar1 + 8) = local_78._24_8_;
    puVar1 = ((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar3 + -0x28;
    *(undefined8 *)puVar1 = local_78._0_8_;
    *(undefined8 *)(puVar1 + 8) = local_78._8_8_;
    puVar1 = ((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar3 + -8;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
                m_data._M_elems + lVar3),&random_script.super_CScriptBase);
    lVar3 = lVar3 + 0x68;
  }
  lVar3 = 8;
  while (bVar4 = in_RCX != 0, in_RCX = in_RCX - 1, bVar4) {
    *(undefined8 *)
     ((long)mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3 + -8) = 1000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar3),
               &random_script.super_CScriptBase);
    lVar3 = lVar3 + 0x28;
  }
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)this);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&random_script.super_CScriptBase);
  CMutableTransaction::~CMutableTransaction(&mtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    CVar5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)CVar5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

inline CTransactionRef create_placeholder_tx(size_t num_inputs, size_t num_outputs)
{
    CMutableTransaction mtx = CMutableTransaction();
    mtx.vin.resize(num_inputs);
    mtx.vout.resize(num_outputs);
    auto random_script = CScript() << ToByteVector(m_rng.rand256()) << ToByteVector(m_rng.rand256());
    for (size_t i{0}; i < num_inputs; ++i) {
        mtx.vin[i].prevout.hash = Txid::FromUint256(m_rng.rand256());
        mtx.vin[i].prevout.n = 0;
        mtx.vin[i].scriptSig = random_script;
    }
    for (size_t o{0}; o < num_outputs; ++o) {
        mtx.vout[o].nValue = 1 * CENT;
        mtx.vout[o].scriptPubKey = random_script;
    }
    return MakeTransactionRef(mtx);
}